

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  double dVar1;
  ostream *poVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  CoeffReturnType pdVar5;
  void *this_00;
  double dVar6;
  __type _Var7;
  Matrix<double,__1,__1,_0,__1,__1> local_558;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_540;
  double local_520;
  Scalar local_518;
  double local_510;
  Scalar local_508;
  Scalar local_500;
  double local_4f8;
  Scalar local_4f0;
  double local_4e8;
  double local_4e0;
  Scalar local_4d8;
  double local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  double local_4b8;
  Scalar local_4b0;
  double local_4a8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_4a0;
  int local_480 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_478;
  float local_45c;
  float local_458;
  float dt_4;
  float dt_3;
  float dt_2;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  double local_410;
  Scalar local_408;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  double local_3e8;
  Scalar local_3e0;
  Scalar local_3d8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_3d0;
  float local_3ac;
  Scalar SStack_3a8;
  float dt;
  Scalar local_3a0;
  double local_398;
  double local_390;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_388;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_348;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_308;
  float local_2e8;
  float local_2e4;
  float vy;
  float vx;
  float py;
  float px;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  Scalar local_280;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_278;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_218;
  Scalar local_1f8;
  Scalar local_1f0;
  Scalar local_1e8;
  Scalar local_1e0;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  Scalar local_190;
  Scalar local_188;
  Scalar local_180;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_178;
  int local_158 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_150;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_b8;
  int local_98 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_90;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  MeasurementPackage *local_18;
  MeasurementPackage *measurement_pack_local;
  FusionEKF *this_local;
  
  local_18 = measurement_pack;
  measurement_pack_local = (MeasurementPackage *)this;
  if ((this->is_initialized_ & 1U) != 0) {
    local_3ac = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) /
                       1000000.0);
    this->previous_timestamp_ = measurement_pack->timestamp_;
    this_00 = (void *)std::ostream::operator<<(&std::cout,local_3ac);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_3d8 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_3d0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).F_,
               &local_3d8);
    local_3e0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_3d0,&local_3e0);
    local_3e8 = (double)local_3ac;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_3e8);
    local_3f0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_3f0);
    local_3f8 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_3f8);
    local_400 = 1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_400);
    local_408 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_408);
    local_410 = (double)local_3ac;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_410);
    local_418 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_418);
    local_420 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_420);
    local_428 = 1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_428);
    local_430 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_430);
    local_438 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_438);
    local_440 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_440);
    local_448 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_448);
    _dt_3 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar4,(Scalar *)&dt_3);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_3d0);
    _Var7 = std::pow<float,int>(local_3ac,2);
    dt_4 = (float)_Var7;
    _Var7 = std::pow<float,int>(local_3ac,3);
    local_458 = (float)_Var7;
    _Var7 = std::pow<float,int>(local_3ac,4);
    local_45c = (float)_Var7;
    local_480[1] = 4;
    local_480[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_478,local_480 + 1,local_480);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).Q_,&local_478);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_478);
    local_4a8 = (double)(local_45c * 0.25 * this->sigma_ax);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_4a0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).Q_,
               &local_4a8);
    local_4b0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_4a0,&local_4b0);
    local_4b8 = (double)(local_458 * 0.5 * this->sigma_ax);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4b8);
    local_4c0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4c0);
    local_4c8 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4c8);
    local_4d0 = (double)(local_45c * 0.25 * this->sigma_ay);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4d0);
    local_4d8 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4d8);
    local_4e0 = (double)(local_458 * 0.5 * this->sigma_ay);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4e0);
    local_4e8 = (double)(local_458 * 0.5 * this->sigma_ax);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4e8);
    local_4f0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4f0);
    local_4f8 = (double)(dt_4 * this->sigma_ax);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_4f8);
    local_500 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_500);
    local_508 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_508);
    local_510 = (double)(local_458 * 0.5 * this->sigma_ay);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_510);
    local_518 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_518);
    local_520 = (double)(dt_4 * this->sigma_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_520)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_4a0);
    KalmanFilter::Predict(&this->ekf_);
    if (local_18->sensor_type_ == RADAR) {
      Tools::CalculateJacobian((MatrixXd *)&local_558,&this->tools,&(this->ekf_).x_);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                (&local_540,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Hj_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_558);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_540);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_558);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->Hj_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_radar_);
      KalmanFilter::UpdateEKF(&this->ekf_,&local_18->raw_measurements_);
    }
    else {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->H_laser_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_laser_);
      KalmanFilter::Update(&this->ekf_,&local_18->raw_measurements_);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &(this->ekf_).x_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &(this->ekf_).P_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"EKF: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_28,4);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->ekf_).x_,&local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_28);
  local_60 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
             &local_60);
  local_68 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_58,&local_68);
  local_70 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_70);
  local_78 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar3,&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_58);
  local_98[1] = 4;
  local_98[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_90,local_98 + 1,local_98);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).F_,&local_90);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_90);
  local_c0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_b8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).F_,
             &local_c0);
  local_c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_b8,&local_c8);
  local_d0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_d0);
  local_d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_d8);
  local_e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_e0);
  local_e8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_e8);
  local_f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_f0);
  local_f8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_f8);
  local_100 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_100);
  local_108 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_108);
  local_110 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_110);
  local_118 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_118);
  local_120 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_120);
  local_128 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_128);
  local_130 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_130);
  local_138 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_138);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_b8);
  local_158[1] = 4;
  local_158[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_150,local_158 + 1,local_158);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).P_,&local_150);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_150);
  local_180 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_178,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).P_,
             &local_180);
  local_188 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_178,&local_188);
  local_190 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_190);
  local_198 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_198);
  local_1a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1a0);
  local_1a8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1a8);
  local_1b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1b0);
  local_1b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1b8);
  local_1c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1c0);
  local_1c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1c8);
  local_1d0 = 1000.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1d0);
  local_1d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1d8);
  local_1e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1e0);
  local_1e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1e8);
  local_1f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_1f0);
  local_1f8 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_1f8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_178);
  local_220 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_218,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_,
             &local_220);
  local_228 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_218,&local_228);
  local_230 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_230);
  local_238 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_238);
  local_240 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_240);
  local_248 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_248);
  local_250 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_250);
  local_258 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_258);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_218);
  local_280 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_278,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Hj_,
             &local_280);
  local_288 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_278,&local_288);
  local_290 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_290);
  local_298 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_298);
  local_2a0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2a0);
  local_2a8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2a8);
  local_2b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2b0);
  local_2b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2b8);
  local_2c0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2c0);
  local_2c8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2c8);
  local_2d0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_2d0);
  _py = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar4,(Scalar *)&py);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_278);
  this->sigma_ax = 9.0;
  this->sigma_ay = 9.0;
  this->previous_timestamp_ = local_18->timestamp_;
  if (local_18->sensor_type_ == RADAR) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,0);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,1);
    dVar6 = cos(*pdVar5);
    vx = (float)(dVar1 * dVar6);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,0);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,1);
    dVar6 = sin(*pdVar5);
    vy = (float)(dVar1 * dVar6);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,2);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,1);
    dVar6 = cos(*pdVar5);
    local_2e4 = (float)(dVar1 * dVar6);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,2);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,1);
    dVar6 = sin(*pdVar5);
    local_2e8 = (float)(dVar1 * dVar6);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &local_18->raw_measurements_,0);
    if ((*pdVar5 != 0.0) || (NAN(*pdVar5))) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      if ((*pdVar5 != 0.0) || (NAN(*pdVar5))) {
        local_350 = (double)vx;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                  (&local_348,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_
                   ,&local_350);
        local_358 = (double)vy;
        pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (&local_348,&local_358);
        local_360 = (double)local_2e4;
        pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar3,&local_360);
        local_368 = (double)local_2e8;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar3,&local_368);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                  (&local_348);
        goto LAB_00104cde;
      }
    }
    local_310 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_308,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
               &local_310);
    local_318 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_308,&local_318);
    local_320 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar3,&local_320);
    local_328 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar3,&local_328);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_308);
  }
  else {
    if (local_18->sensor_type_ == LASER) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      this->px = (float)*pdVar5;
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      this->py = (float)*pdVar5;
      if ((this->px == 0.0) && (!NAN(this->px))) {
        return;
      }
      if ((this->py == 0.0) && (!NAN(this->py))) {
        return;
      }
      local_390 = (double)this->px;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_388,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
                 &local_390);
      local_398 = (double)this->py;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_388,&local_398);
      local_3a0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar3,&local_3a0);
      SStack_3a8 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar3,&stack0xfffffffffffffc58);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_388);
    }
LAB_00104cde:
    this->is_initialized_ = true;
  }
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {


  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {
    /**
    TODO:
      * Initialize the state ekf_.x_ with the first measurement.
      * Create the covariance matrix.
      * Remember: you'll need to convert radar from polar to cartesian coordinates.
    */
    // first measurement
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // initial transition matrix F_
    ekf_.F_ = MatrixXd(4,4);
    ekf_.F_ << 1,0,1,0,
               0,1,0,1,
               0,0,1,0,
               0,0,0,1;

    // initial state covariance matrix P (error in the estimate/prediction)
    ekf_.P_ = MatrixXd (4,4);
    ekf_.P_ << 1,0,0,0,
               0,1,0,0,
               0,0,1000,0,
               0,0,0,1000;

      
    // Laser measurement matrix
    H_laser_ << 1,0,0,0,
                0,1,0,0;

    // Radar measurement matrix
    Hj_ << 1,1,0,0,
           1,1,0,0,
           1,1,1,1;

    // Use sigma_ax = 9 and sigma_ay = 9 for your Q matrix 
    sigma_ax = 9;
    sigma_ay = 9;

    // initial timestamp 
    previous_timestamp_ = measurement_pack.timestamp_;

  

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      /**
      Convert radar from polar to cartesian coordinates and initialize state.
      */
      float px = measurement_pack.raw_measurements_[0]*cos(measurement_pack.raw_measurements_[1]);
      //px = rho * cos(phi)
      float py = measurement_pack.raw_measurements_[0]*sin(measurement_pack.raw_measurements_[1]);
      //py = rho * sin(phi)
      float vx = measurement_pack.raw_measurements_[2]*cos(measurement_pack.raw_measurements_[1]);
      //vx = rho_dot * cos(phi)
      float vy = measurement_pack.raw_measurements_[2]*sin(measurement_pack.raw_measurements_[1]);
      //vy = rho_dot * sin(phi)


      if (measurement_pack.raw_measurements_[0] == 0 or measurement_pack.raw_measurements_[1] == 0){
        ekf_.x_<< 0, 0, 0, 0;
        return;
      }
      
      ekf_.x_ <<px, py, vx, vy;
       
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      /**
      Initialize state.
      */
      px = measurement_pack.raw_measurements_[0];
      py = measurement_pack.raw_measurements_[1];

      if (px == 0 or py == 0){
        return;
      }
      ekf_.x_<<px, py, 0, 0;
    }

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  /**
   TODO:
     * Update the state transition matrix F according to the new elapsed time.
      - Time is measured in seconds.
     * Update the process noise covariance matrix.
     * Use sigma_ax = 9 and sigma_ay = 9 for your Q matrix.
   */
  //dt - convert delta time to seconds
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0; 
  previous_timestamp_ = measurement_pack.timestamp_;
  cout << dt << endl;
  
  //update the transision Matrix F
  ekf_.F_ << 1, 0, dt, 0,
             0, 1, 0, dt,
             0, 0, 1, 0,
             0, 0, 0, 1;

  float dt_2 = pow(dt, 2);
  float dt_3 = pow(dt, 3);
  float dt_4 = pow(dt, 4);
  
  //set the process noise covariance matrix Q
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ <<  (dt_4/4)*sigma_ax, 0, (dt_3/2)*sigma_ax, 0,
              0, (dt_4/4)*sigma_ay, 0, (dt_3/2)*sigma_ay,
              (dt_3/2)*sigma_ax, 0, dt_2*sigma_ax, 0,
              0, (dt_3/2)*sigma_ay, 0, dt_2*sigma_ay;


  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  /**
   TODO:
     * Use the sensor type to perform the update step.
     * Update the state and covariance matrices.
   */

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    // Radar updates
    Hj_ << tools.CalculateJacobian(ekf_.x_);
    ekf_.H_ = Hj_;
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);  
  } 
  else {
    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }
  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}